

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_pfirst_pnext(DisasContext_conflict1 *s,arg_rr_esz *a,
                     _func_void_TCGContext_ptr_TCGv_i32_TCGv_ptr_TCGv_ptr_TCGv_i32 *gen_fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t val;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_i32 t_00;
  uint desc;
  TCGv_i32 t;
  TCGv_ptr t_pg;
  TCGv_ptr t_pd;
  TCGContext_conflict1 *tcg_ctx;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_ptr_TCGv_ptr_TCGv_i32 *gen_fn_local;
  arg_rr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    r = tcg_temp_new_ptr(tcg_ctx_00);
    r_00 = tcg_temp_new_ptr(tcg_ctx_00);
    iVar3 = pred_full_reg_size(s);
    val = deposit32((iVar3 + 7) / 8,10,2,a->esz);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,a->rd);
    tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar1,(long)iVar3);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,a->rn);
    tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar1,(long)iVar3);
    t_00 = tcg_const_i32_aarch64(tcg_ctx_00,val);
    (*gen_fn)(tcg_ctx_00,t_00,r,r_00,t_00);
    tcg_temp_free_ptr(tcg_ctx_00,r);
    tcg_temp_free_ptr(tcg_ctx_00,r_00);
    do_pred_flags(tcg_ctx_00,t_00);
    tcg_temp_free_i32(tcg_ctx_00,t_00);
  }
  return true;
}

Assistant:

static bool do_pfirst_pnext(DisasContext *s, arg_rr_esz *a,
                            void (*gen_fn)(TCGContext *, TCGv_i32, TCGv_ptr,
                                           TCGv_ptr, TCGv_i32))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    TCGv_ptr t_pd = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr t_pg = tcg_temp_new_ptr(tcg_ctx);
    TCGv_i32 t;
    unsigned desc;

    desc = DIV_ROUND_UP(pred_full_reg_size(s), 8);
    desc = deposit32(desc, SIMD_DATA_SHIFT, 2, a->esz);

    tcg_gen_addi_ptr(tcg_ctx, t_pd, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rn));
    t = tcg_const_i32(tcg_ctx, desc);

    gen_fn(tcg_ctx, t, t_pd, t_pg, t);
    tcg_temp_free_ptr(tcg_ctx, t_pd);
    tcg_temp_free_ptr(tcg_ctx, t_pg);

    do_pred_flags(tcg_ctx, t);
    tcg_temp_free_i32(tcg_ctx, t);
    return true;
}